

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfAttacher::initAttachment
          (BufferTfAttacher *this,GLuint seed,GLuint buffer)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  initBuffer((Functions *)CONCAT44(extraout_var,iVar1),seed,0x88e9,buffer);
  local_198._0_8_ = ((this->super_Attacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Initialized buffer ",0x16);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," from seed ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void BufferTfAttacher::initAttachment (GLuint seed, GLuint buffer)
{
	initBuffer(gl(), seed, GL_DYNAMIC_READ, buffer);
	log() << TestLog::Message << "// Initialized buffer " << buffer << " from seed " << seed
		  << TestLog::EndMessage;
}